

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzePostModify(ExpressionContext *ctx,SynPostModify *syntax)

{
  bool bVar1;
  ExprVariableAccess *value_00;
  ExprVariableAccess *pEVar2;
  TypeRef *type;
  VariableHandle *this;
  ExprDereference *pEVar3;
  TypeBase *pTVar4;
  char *local_a0;
  ExprDereference *node_1;
  ExprVariableAccess *node;
  ExprBase *wrapped;
  ExprBase *value;
  SynPostModify *syntax_local;
  ExpressionContext *ctx_local;
  
  value_00 = (ExprVariableAccess *)AnalyzeExpression(ctx,syntax->value);
  bVar1 = isType<TypeError>((value_00->super_ExprBase).type);
  if (bVar1) {
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprPreModify>(ctx);
    pTVar4 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprPreModify::ExprPreModify
              ((ExprPreModify *)ctx_local,&syntax->super_SynBase,pTVar4,(ExprBase *)value_00,
               (bool)(syntax->isIncrement & 1));
  }
  else {
    pEVar2 = getType<ExprVariableAccess>((ExprBase *)value_00);
    if (pEVar2 == (ExprVariableAccess *)0x0) {
      pEVar3 = getType<ExprDereference>((ExprBase *)value_00);
      node = value_00;
      if (pEVar3 != (ExprDereference *)0x0) {
        node = (ExprVariableAccess *)pEVar3->value;
      }
    }
    else {
      node = (ExprVariableAccess *)ExpressionContext::get<ExprGetAddress>(ctx);
      type = ExpressionContext::GetReferenceType(ctx,(value_00->super_ExprBase).type);
      this = ExpressionContext::get<VariableHandle>(ctx);
      VariableHandle::VariableHandle(this,(pEVar2->super_ExprBase).source,pEVar2->variable);
      ExprGetAddress::ExprGetAddress
                ((ExprGetAddress *)node,&syntax->super_SynBase,&type->super_TypeBase,this);
    }
    AssertValueExpression(ctx,&syntax->super_SynBase,(ExprBase *)value_00);
    bVar1 = isType<TypeRef>((node->super_ExprBase).type);
    if (bVar1) {
      bVar1 = ExpressionContext::IsNumericType(ctx,(value_00->super_ExprBase).type);
      if (bVar1) {
        ctx_local = (ExpressionContext *)ExpressionContext::get<ExprPostModify>(ctx);
        ExprPostModify::ExprPostModify
                  ((ExprPostModify *)ctx_local,&syntax->super_SynBase,
                   (value_00->super_ExprBase).type,&node->super_ExprBase,
                   (bool)(syntax->isIncrement & 1));
      }
      else {
        pTVar4 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        if ((syntax->isIncrement & 1U) == 0) {
          local_a0 = "decrement";
        }
        else {
          local_a0 = "increment";
        }
        ctx_local = (ExpressionContext *)
                    anon_unknown.dwarf_6f1cc::ReportExpected
                              (ctx,&syntax->super_SynBase,pTVar4,
                               "ERROR: %s is not supported on \'%.*s\'",local_a0,
                               (ulong)(uint)((int)(((value_00->super_ExprBase).type)->name).end -
                                            (int)(((value_00->super_ExprBase).type)->name).begin),
                               (((value_00->super_ExprBase).type)->name).begin);
      }
    }
    else {
      pTVar4 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      ctx_local = (ExpressionContext *)
                  anon_unknown.dwarf_6f1cc::ReportExpected
                            (ctx,&syntax->super_SynBase,pTVar4,
                             "ERROR: cannot change immutable value of type %.*s",
                             (ulong)(uint)((int)(((value_00->super_ExprBase).type)->name).end -
                                          (int)(((value_00->super_ExprBase).type)->name).begin),
                             (((value_00->super_ExprBase).type)->name).begin);
    }
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzePostModify(ExpressionContext &ctx, SynPostModify *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprPreModify>()) ExprPreModify(syntax, ctx.GetErrorType(), value, syntax->isIncrement);

	ExprBase* wrapped = value;

	if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
		wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(syntax, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
	else if(ExprDereference *node = getType<ExprDereference>(value))
		wrapped = node->value;

	AssertValueExpression(ctx, syntax, value);

	if(!isType<TypeRef>(wrapped->type))
		return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot change immutable value of type %.*s", FMT_ISTR(value->type->name));

	if(!ctx.IsNumericType(value->type))
		return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: %s is not supported on '%.*s'", (syntax->isIncrement ? "increment" : "decrement"), FMT_ISTR(value->type->name));

	return new (ctx.get<ExprPostModify>()) ExprPostModify(syntax, value->type, wrapped, syntax->isIncrement);
}